

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

uint64_t Imf_3_4::anon_unknown_0::getBits(int nBits,uint64_t *c,int *lc,char **in)

{
  uint64_t uVar1;
  byte *pbVar2;
  char **in_local;
  int *lc_local;
  uint64_t *c_local;
  int nBits_local;
  
  while (*lc < nBits) {
    uVar1 = *c;
    pbVar2 = (byte *)*in;
    *in = (char *)(pbVar2 + 1);
    *c = uVar1 << 8 | (ulong)*pbVar2;
    *lc = *lc + 8;
  }
  *lc = *lc - nBits;
  return *c >> ((byte)*lc & 0x3f) & (long)((1 << ((byte)nBits & 0x1f)) + -1);
}

Assistant:

inline uint64_t
getBits (int nBits, uint64_t& c, int& lc, const char*& in)
{
    while (lc < nBits)
    {
        c = (c << 8) | *(unsigned char*) (in++);
        lc += 8;
    }

    lc -= nBits;
    return (c >> lc) & ((1 << nBits) - 1);
}